

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  byte bVar1;
  bool bVar2;
  color_t cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  size_type sVar9;
  uint uVar10;
  undefined1 local_368 [8];
  char padding [192];
  color_t local_2a0;
  color_t local_29d;
  color_t local_29a;
  color_t local_297;
  uint local_294;
  int local_290;
  int c;
  int x;
  int y;
  value_type *img;
  int i;
  ofstream out;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  vector<Image,_std::allocator<Image>_> pymask_images;
  char *cgamask_filename;
  char *pymask_filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar7 = std::operator<<(poVar7,*argv);
    std::operator<<(poVar7," pymask.pic cgamask.pic\n");
    std::operator<<((ostream *)&std::cerr,
                    "Converts pymask.pic from EGA to CGA and stores it in to cgamask.pic\n");
    argv_local._4_4_ = 1;
  }
  else {
    __s = argv[1];
    pymask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    LoadEgaSpritesheet((vector<Image,_std::allocator<Image>_> *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    std::ofstream::ofstream
              (&i,(char *)pymask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,_S_bin);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open: ");
      poVar7 = std::operator<<(poVar7,(char *)pymask_images.
                                              super__Vector_base<Image,_std::allocator<Image>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar7,"\n");
      argv_local._4_4_ = 1;
    }
    else {
      img._0_4_ = 0;
      while( true ) {
        uVar8 = (ulong)(int)img;
        sVar9 = std::vector<Image,_std::allocator<Image>_>::size
                          ((vector<Image,_std::allocator<Image>_> *)local_40);
        if (sVar9 <= uVar8) break;
        _x = std::vector<Image,_std::allocator<Image>_>::operator[]
                       ((vector<Image,_std::allocator<Image>_> *)local_40,(long)(int)img);
        std::ostream::put((char)&i);
        std::ostream::put((char)&i);
        std::ostream::put((char)&i);
        std::ostream::put((char)&i);
        c = 0;
        while( true ) {
          iVar6 = c;
          iVar4 = Image::GetHeight(_x);
          if (iVar4 <= iVar6) break;
          local_290 = 0;
          while( true ) {
            iVar6 = local_290;
            iVar4 = Image::GetWidth(_x);
            if (iVar4 <= iVar6) break;
            cVar3 = Image::Get(_x,local_290,c);
            local_297._0_2_ = cVar3._0_2_;
            local_297.b = cVar3.b;
            bVar2 = operator==(&local_297,&color_white);
            uVar5 = 0;
            if (bVar2) {
              uVar5 = 0xc0;
            }
            cVar3 = Image::Get(_x,local_290 + 1,c);
            local_29a._0_2_ = cVar3._0_2_;
            local_29a.b = cVar3.b;
            bVar2 = operator==(&local_29a,&color_white);
            uVar10 = 0;
            if (bVar2) {
              uVar10 = 0x30;
            }
            cVar3 = Image::Get(_x,local_290 + 2,c);
            local_29d._0_2_ = cVar3._0_2_;
            local_29d.b = cVar3.b;
            bVar2 = operator==(&local_29d,&color_white);
            local_294 = 0;
            if (bVar2) {
              local_294 = 0xc;
            }
            local_294 = uVar5 | uVar10 | local_294;
            iVar6 = Image::GetWidth(_x);
            if (iVar6 - local_290 != 3) {
              cVar3 = Image::Get(_x,local_290 + 3,c);
              local_2a0._0_2_ = cVar3._0_2_;
              local_2a0.b = cVar3.b;
              bVar2 = operator==(&local_2a0,&color_white);
              uVar5 = 0;
              if (bVar2) {
                uVar5 = 3;
              }
              local_294 = uVar5 | local_294;
            }
            std::ostream::put((char)&i);
            local_290 = local_290 + 4;
          }
          c = c + 1;
        }
        std::ostream::write((char *)&i,(long)local_368);
        img._0_4_ = (int)img + 1;
      }
      argv_local._4_4_ = 0;
    }
    img._4_4_ = 1;
    std::ofstream::~ofstream(&i);
    std::vector<Image,_std::allocator<Image>_>::~vector
              ((vector<Image,_std::allocator<Image>_> *)local_40);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  if (argc < 3) {
    std::cerr << "Usage: " << argv[0] << " pymask.pic cgamask.pic\n";
    std::cerr << "Converts pymask.pic from EGA to CGA and stores it in to "
                 "cgamask.pic\n";
    return 1;
  }

  auto const pymask_filename = argv[1];
  auto const cgamask_filename = argv[2];

  auto const pymask_images = LoadEgaSpritesheet(pymask_filename);

  std::ofstream out(cgamask_filename, std::ios_base::binary);
  if (!out.good()) {
    std::cerr << "Couldn't open: " << cgamask_filename << "\n";
    return 1;
  }

  for (auto i = 0; i < pymask_images.size(); ++i) {
    auto const& img = pymask_images[i];

    // First, write "CGA header". If this is missing then the data will be
    // ignored.
    out.put(0x0E);
    out.put(0x00);
    out.put(0x0E);
    out.put(0x00);

    // Then Dump image (fit width=15 into cell of size 16)
    for (auto y = 0; y < img.GetHeight(); ++y) {
      for (auto x = 0; x < img.GetWidth(); x += 4) {
        // TODO more generic function that handles incomplete rows
        auto c = (img.Get(x, y) == color_white ? 0b11000000 : 0) |
                 (img.Get(x + 1, y) == color_white ? 0b00110000 : 0) |
                 (img.Get(x + 2, y) == color_white ? 0b00001100 : 0);

        // Non-full row (can happen because image data is 15x15)
        if (img.GetWidth() - x != 3) {
          c |= img.Get(x + 3, y) == color_white ? 0b00000011 : 0;
        }

        out.put(c);
      }
    }

    // finally Write 192 bytes of garbage
    char padding[192];
    out.write(padding, sizeof(padding));
  }

  return 0;
}